

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_storage.cpp
# Opt level: O3

bool __thiscall
miniros::master::ParameterStorage::unsubscribeParam
          (ParameterStorage *this,string *caller_id,string *caller_api,string *key)

{
  int iVar1;
  iterator iVar2;
  long *plVar3;
  size_type *psVar4;
  _Base_ptr p_Var5;
  pair<std::_Rb_tree_iterator<std::shared_ptr<miniros::master::NodeRef>_>,_std::_Rb_tree_iterator<std::shared_ptr<miniros::master::NodeRef>_>_>
  pVar6;
  string fullKey;
  shared_ptr<miniros::master::NodeRef> nodeRef;
  Path path;
  string local_c0;
  undefined1 local_a0 [16];
  _Base_ptr local_90 [2];
  undefined1 local_80 [16];
  _Rb_tree_node_base local_70 [2];
  
  if (console::g_initialized == '\0') {
    console::initialize();
  }
  if (unsubscribeParam::loc.initialized_ == false) {
    local_a0._0_8_ = (element_type *)local_90;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a0,"miniros.unknown_package","");
    plVar3 = (long *)::std::__cxx11::string::append(local_a0);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_c0.field_2._M_allocated_capacity = *psVar4;
      local_c0.field_2._8_8_ = plVar3[3];
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar4;
      local_c0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_c0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::append((char *)&local_c0);
    p_Var5 = (_Base_ptr)(plVar3 + 2);
    if ((_Base_ptr)*plVar3 == p_Var5) {
      local_70[0]._0_8_ = *(undefined8 *)p_Var5;
      local_70[0]._M_parent = (_Base_ptr)plVar3[3];
      local_80._0_8_ = (_Base_ptr)(local_80 + 0x10);
    }
    else {
      local_70[0]._0_8_ = *(undefined8 *)p_Var5;
      local_80._0_8_ = (_Base_ptr)*plVar3;
    }
    local_80._8_8_ = plVar3[1];
    *plVar3 = (long)p_Var5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    console::initializeLogLocation(&unsubscribeParam::loc,(string *)local_80,Info);
    if ((_Base_ptr)local_80._0_8_ != (_Base_ptr)(local_80 + 0x10)) {
      operator_delete((void *)local_80._0_8_,(ulong)(local_70[0]._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((element_type *)local_a0._0_8_ != (element_type *)local_90) {
      operator_delete((void *)local_a0._0_8_,(ulong)((long)&local_90[0]->_M_color + 1));
    }
  }
  if (unsubscribeParam::loc.level_ != Info) {
    unsubscribeParam();
  }
  if (unsubscribeParam::loc.logger_enabled_ == true) {
    unsubscribeParam();
  }
  names::resolve(&local_c0,caller_id,key,false);
  names::Path::Path((Path *)local_80);
  names::Path::fromString((Path *)local_80,&local_c0);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_parameterLock);
  if (iVar1 == 0) {
    if (this->m_regManager != (RegistrationManager *)0x0) {
      iVar2 = ::std::
              _Rb_tree<miniros::names::Path,_std::pair<const_miniros::names::Path,_std::set<std::shared_ptr<miniros::master::NodeRef>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>_>,_std::_Select1st<std::pair<const_miniros::names::Path,_std::set<std::shared_ptr<miniros::master::NodeRef>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>_>_>,_std::less<miniros::names::Path>,_std::allocator<std::pair<const_miniros::names::Path,_std::set<std::shared_ptr<miniros::master::NodeRef>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>_>_>_>
              ::find(&(this->m_parameterListeners)._M_t,(key_type *)local_80);
      if ((_Rb_tree_header *)iVar2._M_node !=
          &(this->m_parameterListeners)._M_t._M_impl.super__Rb_tree_header) {
        RegistrationManager::getNodeByName
                  ((RegistrationManager *)local_a0,(string *)this->m_regManager);
        pVar6 = ::std::
                _Rb_tree<std::shared_ptr<miniros::master::NodeRef>,_std::shared_ptr<miniros::master::NodeRef>,_std::_Identity<std::shared_ptr<miniros::master::NodeRef>_>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
                ::equal_range((_Rb_tree<std::shared_ptr<miniros::master::NodeRef>,_std::shared_ptr<miniros::master::NodeRef>,_std::_Identity<std::shared_ptr<miniros::master::NodeRef>_>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
                               *)&iVar2._M_node[3]._M_left,(key_type *)local_a0);
        ::std::
        _Rb_tree<std::shared_ptr<miniros::master::NodeRef>,_std::shared_ptr<miniros::master::NodeRef>,_std::_Identity<std::shared_ptr<miniros::master::NodeRef>_>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
        ::_M_erase_aux((_Rb_tree<std::shared_ptr<miniros::master::NodeRef>,_std::shared_ptr<miniros::master::NodeRef>,_std::_Identity<std::shared_ptr<miniros::master::NodeRef>_>,_std::less<std::shared_ptr<miniros::master::NodeRef>_>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
                        *)&iVar2._M_node[3]._M_left,(_Base_ptr)pVar6.first._M_node,
                       (_Base_ptr)pVar6.second._M_node);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_parameterLock);
    names::Path::~Path((Path *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    return true;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

bool ParameterStorage::unsubscribeParam(
  const std::string& caller_id, const std::string& caller_api, const std::string& key)
{
  MINIROS_INFO_NAMED("rosparam", "unsubscribeParam(\"%s\") from %s, api=%s", key.c_str(), caller_id.c_str(), caller_api.c_str());

  std::string fullKey = miniros::names::resolve(caller_id, key, false);

  names::Path path;
  path.fromString(fullKey);

  std::scoped_lock<std::mutex> lock(m_parameterLock);
  if (m_regManager) {
    auto it = m_parameterListeners.find(path);
    if (it != m_parameterListeners.end()) {
      std::shared_ptr<NodeRef> nodeRef = m_regManager->getNodeByName(caller_id);
      it->second.erase(nodeRef);
    }
  }
  return true;
}